

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O2

void empty_port::impl<(empty_port::Kind)0>::fill_struct
               (socket_t *param_1,sockaddr_in *addr,port_t port,char *host)

{
  int __errnum;
  runtime_error *this;
  char *__rhs;
  allocator local_91;
  addrinfo *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  addrinfo hints;
  
  addr->sin_zero[4] = '\0';
  addr->sin_zero[5] = '\0';
  addr->sin_zero[6] = '\0';
  addr->sin_zero[7] = '\0';
  addr->sin_addr = 0;
  addr->sin_zero[0] = '\0';
  addr->sin_zero[1] = '\0';
  addr->sin_zero[2] = '\0';
  addr->sin_zero[3] = '\0';
  addr->sin_family = 2;
  addr->sin_port = port << 8 | port >> 8;
  result = (addrinfo *)0x0;
  hints.ai_flags = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_family = 2;
  hints.ai_socktype = 1;
  __errnum = getaddrinfo(host,(char *)0x0,(addrinfo *)&hints,(addrinfo **)&result);
  if (__errnum == 0) {
    (addr->sin_addr).s_addr = *(in_addr_t *)(result->ai_addr->sa_data + 2);
    freeaddrinfo((addrinfo *)result);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_88,"Cannot getaddrinfo:: ",&local_91);
  __rhs = strerror(__errnum);
  std::operator+(&local_68,&local_88,__rhs);
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void impl<TCP>::fill_struct(const socket_t & /*socket*/, sockaddr_in &addr,
                                   const port_t port, const char *host) {
    std::memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);

    struct addrinfo hints, *result = NULL;
    std::memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_INET;
    hints.ai_socktype = SOCK_STREAM;

    struct sockaddr_in *host_addr;
    // looks up IPv4/IPv6 address by host name or stringized IP address
    int r = getaddrinfo(host, NULL, &hints, &result);
    if (r) {
        throw std::runtime_error(std::string("Cannot getaddrinfo:: ") +
                                 strerror(r));
    }
    host_addr = (struct sockaddr_in *)result->ai_addr;
    memcpy(&addr.sin_addr, &host_addr->sin_addr, sizeof(struct in_addr));
    freeaddrinfo(result);
}